

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

DeviceType Diligent::DearchiverBase::GetArchiveDeviceType(IRenderDevice *pDevice)

{
  int iVar1;
  DeviceType DVar2;
  undefined4 extraout_var;
  char (*in_RCX) [19];
  string msg;
  string local_30;
  
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x3559fc,in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetArchiveDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,99);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  DVar2 = RenderDeviceTypeToArchiveDeviceType(*(RENDER_DEVICE_TYPE *)CONCAT44(extraout_var,iVar1));
  return DVar2;
}

Assistant:

DearchiverBase::DeviceType DearchiverBase::GetArchiveDeviceType(const IRenderDevice* pDevice)
{
    VERIFY_EXPR(pDevice != nullptr);
    const RENDER_DEVICE_TYPE Type = pDevice->GetDeviceInfo().Type;
    return RenderDeviceTypeToArchiveDeviceType(Type);
}